

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_drds_list_un_complete_tasks.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_6320c::Json2Array<aliyun::DrdsListUnCompleteTaskstaskType>::Json2Array
          (Json2Array<aliyun::DrdsListUnCompleteTaskstaskType> *this,Value *value,
          vector<aliyun::DrdsListUnCompleteTaskstaskType,_std::allocator<aliyun::DrdsListUnCompleteTaskstaskType>_>
          *vec)

{
  undefined4 uVar1;
  bool bVar2;
  ArrayIndex AVar3;
  Value *value_00;
  undefined1 local_120 [8];
  DrdsListUnCompleteTaskstaskType val;
  int i;
  vector<aliyun::DrdsListUnCompleteTaskstaskType,_std::allocator<aliyun::DrdsListUnCompleteTaskstaskType>_>
  *vec_local;
  Value *value_local;
  Json2Array<aliyun::DrdsListUnCompleteTaskstaskType> *this_local;
  
  bVar2 = Json::Value::isArray(value);
  if (bVar2) {
    for (val.err_msg.field_2._12_4_ = 0; uVar1 = val.err_msg.field_2._12_4_,
        AVar3 = Json::Value::size(value), (uint)uVar1 < AVar3;
        val.err_msg.field_2._12_4_ = val.err_msg.field_2._12_4_ + 1) {
      aliyun::DrdsListUnCompleteTaskstaskType::DrdsListUnCompleteTaskstaskType
                ((DrdsListUnCompleteTaskstaskType *)local_120);
      value_00 = Json::Value::operator[](value,val.err_msg.field_2._12_4_);
      anon_unknown.dwarf_6320c::Json2Type(value_00,(DrdsListUnCompleteTaskstaskType *)local_120);
      std::
      vector<aliyun::DrdsListUnCompleteTaskstaskType,_std::allocator<aliyun::DrdsListUnCompleteTaskstaskType>_>
      ::push_back(vec,(value_type *)local_120);
      aliyun::DrdsListUnCompleteTaskstaskType::~DrdsListUnCompleteTaskstaskType
                ((DrdsListUnCompleteTaskstaskType *)local_120);
    }
  }
  return;
}

Assistant:

Json2Array(const Json::Value& value, std::vector<T>* vec) {
    if(!value.isArray()) {
      return;
    }
    for(int i = 0; i < value.size(); i++) {
      T val;
      Json2Type(value[i], &val);
      vec->push_back(val);
    }
  }